

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_RgbToBgr(RgbToBgrForm2 RgbToBgr,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  reference pvVar2;
  code *in_RDI;
  pair<double,_double> pVar3;
  uint32_t i;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer *in_stack_ffffffffffffff60;
  reference in_stack_ffffffffffffff70;
  uint local_74;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  
  Test_Helper::uniformRGBImages
            (in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  SetupFunction((string *)0x174523);
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff60);
  local_74 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= local_74) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff70 =
         std::
         vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
         ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       *)&stack0xffffffffffffffc0,0);
    pvVar2 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&stack0xffffffffffffffc0,1);
    (*in_RDI)(in_stack_ffffffffffffff70,pvVar2);
    Performance_Test::TimerContainer::stop((TimerContainer *)in_stack_ffffffffffffff70);
    local_74 = local_74 + 1;
  }
  CleanupFunction((string *)0x174605);
  pVar3 = Performance_Test::BaseTimerContainer::mean
                    ((BaseTimerContainer *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x174645);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff70);
  return pVar3;
}

Assistant:

std::pair < double, double > template_RgbToBgr( RgbToBgrForm2 RgbToBgr, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformRGBImages( 2, size, size );

        TEST_FUNCTION_LOOP( RgbToBgr( image[0], image[1] ), namespaceName )
    }